

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::BasicAllFormatsLoadStoreComputeStage::Run
          (BasicAllFormatsLoadStoreComputeStage *this)

{
  bool bVar1;
  ContextInfo *this_00;
  Vector<float,_4> local_4f8;
  Vector<float,_4> local_4e8;
  Vector<float,_4> local_4d8;
  Vector<float,_4> local_4c8;
  Vector<float,_4> local_4b8;
  Vector<float,_4> local_4a8;
  Vector<float,_4> local_498;
  Vector<float,_4> local_488;
  Vector<float,_4> local_478;
  Vector<float,_4> local_468;
  Vector<float,_4> local_458;
  Vector<float,_4> local_448;
  Vector<float,_4> local_438;
  Vector<float,_4> local_428;
  Vector<float,_4> local_418;
  Vector<float,_4> local_408;
  Vector<float,_4> local_3f8;
  Vector<float,_4> local_3e8;
  Vector<float,_4> local_3d8;
  Vector<float,_4> local_3c8;
  Vector<float,_4> local_3b8;
  Vector<float,_4> local_3a8;
  Vector<float,_4> local_398;
  Vector<float,_4> local_388;
  Vector<float,_4> local_378;
  Vector<float,_4> local_368;
  Vector<unsigned_int,_4> local_358;
  Vector<unsigned_int,_4> local_348;
  Vector<unsigned_int,_4> local_338;
  Vector<unsigned_int,_4> local_328;
  Vector<unsigned_int,_4> local_318;
  Vector<unsigned_int,_4> local_308;
  Vector<unsigned_int,_4> local_2f8;
  Vector<unsigned_int,_4> local_2e8;
  Vector<unsigned_int,_4> local_2d8;
  Vector<unsigned_int,_4> local_2c8;
  Vector<unsigned_int,_4> local_2b8;
  Vector<unsigned_int,_4> local_2a8;
  Vector<unsigned_int,_4> local_298;
  Vector<unsigned_int,_4> local_288;
  Vector<unsigned_int,_4> local_278;
  Vector<unsigned_int,_4> local_268;
  Vector<unsigned_int,_4> local_258;
  Vector<unsigned_int,_4> local_248;
  Vector<unsigned_int,_4> local_238;
  Vector<unsigned_int,_4> local_228;
  Vector<int,_4> local_218;
  Vector<int,_4> local_208;
  Vector<int,_4> local_1f8;
  Vector<int,_4> local_1e8;
  Vector<int,_4> local_1d8;
  Vector<int,_4> local_1c8;
  Vector<int,_4> local_1b8;
  Vector<int,_4> local_1a8;
  Vector<int,_4> local_198;
  Vector<int,_4> local_188;
  Vector<int,_4> local_178;
  Vector<int,_4> local_168;
  Vector<float,_4> local_158;
  Vector<float,_4> local_148;
  Vector<int,_4> local_138;
  Vector<int,_4> local_128;
  Vector<int,_4> local_118;
  Vector<int,_4> local_108;
  Vector<int,_4> local_f8;
  Vector<int,_4> local_e8;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  Vector<float,_4> local_28;
  BasicAllFormatsLoadStoreComputeStage *local_18;
  BasicAllFormatsLoadStoreComputeStage *this_local;
  
  local_18 = this;
  this_00 = deqp::Context::getContextInfo
                      ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                       m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_compute_shader");
  if (bVar1) {
    tcu::Vector<float,_4>::Vector(&local_28,1.0,2.0,3.0,4.0);
    tcu::Vector<float,_4>::Vector(&local_38,1.0,2.0,3.0,4.0);
    bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
            Read<tcu::Vector<float,4>>
                      ((BasicAllFormatsLoadStoreComputeStage *)this,0x8814,&local_28,&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcu::Vector<float,_4>::Vector(&local_48,1.0,2.0,3.0,4.0);
      tcu::Vector<float,_4>::Vector(&local_58,1.0,2.0,0.0,1.0);
      bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
              Read<tcu::Vector<float,4>>
                        ((BasicAllFormatsLoadStoreComputeStage *)this,0x8230,&local_48,&local_58);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        tcu::Vector<float,_4>::Vector(&local_68,1.0,2.0,3.0,4.0);
        tcu::Vector<float,_4>::Vector(&local_78,1.0,0.0,0.0,1.0);
        bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                Read<tcu::Vector<float,4>>
                          ((BasicAllFormatsLoadStoreComputeStage *)this,0x822e,&local_68,&local_78);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          tcu::Vector<float,_4>::Vector(&local_88,1.0,2.0,3.0,4.0);
          tcu::Vector<float,_4>::Vector(&local_98,1.0,2.0,3.0,4.0);
          bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                  Read<tcu::Vector<float,4>>
                            ((BasicAllFormatsLoadStoreComputeStage *)this,0x881a,&local_88,&local_98
                            );
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            tcu::Vector<float,_4>::Vector(&local_a8,1.0,2.0,3.0,4.0);
            tcu::Vector<float,_4>::Vector(&local_b8,1.0,2.0,0.0,1.0);
            bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                    Read<tcu::Vector<float,4>>
                              ((BasicAllFormatsLoadStoreComputeStage *)this,0x822f,&local_a8,
                               &local_b8);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              tcu::Vector<float,_4>::Vector(&local_c8,1.0,2.0,3.0,4.0);
              tcu::Vector<float,_4>::Vector(&local_d8,1.0,0.0,0.0,1.0);
              bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                      Read<tcu::Vector<float,4>>
                                ((BasicAllFormatsLoadStoreComputeStage *)this,0x822d,&local_c8,
                                 &local_d8);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                tcu::Vector<int,_4>::Vector(&local_e8,1,-2,3,-4);
                tcu::Vector<int,_4>::Vector(&local_f8,1,-2,3,-4);
                bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                        Read<tcu::Vector<int,4>>
                                  ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d82,&local_e8,
                                   &local_f8);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  tcu::Vector<int,_4>::Vector(&local_108,1,-2,3,-4);
                  tcu::Vector<int,_4>::Vector(&local_118,1,-2,0,1);
                  bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                          Read<tcu::Vector<int,4>>
                                    ((BasicAllFormatsLoadStoreComputeStage *)this,0x823b,&local_108,
                                     &local_118);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    tcu::Vector<int,_4>::Vector(&local_128,1,-2,3,-4);
                    tcu::Vector<int,_4>::Vector(&local_138,1,0,0,1);
                    bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                            Read<tcu::Vector<int,4>>
                                      ((BasicAllFormatsLoadStoreComputeStage *)this,0x8235,
                                       &local_128,&local_138);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      tcu::Vector<float,_4>::Vector(&local_148,1.0,2.0,3.0,4.0);
                      tcu::Vector<float,_4>::Vector(&local_158,1.0,2.0,3.0,1.0);
                      bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage::
                              Read<tcu::Vector<float,4>>
                                        ((BasicAllFormatsLoadStoreComputeStage *)this,0x8c3a,
                                         &local_148,&local_158);
                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                        tcu::Vector<int,_4>::Vector(&local_168,1,-2,3,-4);
                        tcu::Vector<int,_4>::Vector(&local_178,1,-2,3,-4);
                        bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage
                                ::Read<tcu::Vector<int,4>>
                                          ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d88,
                                           &local_168,&local_178);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          tcu::Vector<int,_4>::Vector(&local_188,1,-2,3,-4);
                          tcu::Vector<int,_4>::Vector(&local_198,1,-2,0,1);
                          bVar1 = gl4cts::(anonymous_namespace)::
                                  BasicAllFormatsLoadStoreComputeStage::Read<tcu::Vector<int,4>>
                                            ((BasicAllFormatsLoadStoreComputeStage *)this,0x8239,
                                             &local_188,&local_198);
                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                            tcu::Vector<int,_4>::Vector(&local_1a8,1,-2,3,-4);
                            tcu::Vector<int,_4>::Vector(&local_1b8,1,0,0,1);
                            bVar1 = gl4cts::(anonymous_namespace)::
                                    BasicAllFormatsLoadStoreComputeStage::Read<tcu::Vector<int,4>>
                                              ((BasicAllFormatsLoadStoreComputeStage *)this,0x8233,
                                               &local_1a8,&local_1b8);
                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                              tcu::Vector<int,_4>::Vector(&local_1c8,1,-2,3,-4);
                              tcu::Vector<int,_4>::Vector(&local_1d8,1,-2,3,-4);
                              bVar1 = gl4cts::(anonymous_namespace)::
                                      BasicAllFormatsLoadStoreComputeStage::Read<tcu::Vector<int,4>>
                                                ((BasicAllFormatsLoadStoreComputeStage *)this,0x8d8e
                                                 ,&local_1c8,&local_1d8);
                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                tcu::Vector<int,_4>::Vector(&local_1e8,1,-2,3,-4);
                                tcu::Vector<int,_4>::Vector(&local_1f8,1,-2,0,1);
                                bVar1 = gl4cts::(anonymous_namespace)::
                                        BasicAllFormatsLoadStoreComputeStage::
                                        Read<tcu::Vector<int,4>>
                                                  ((BasicAllFormatsLoadStoreComputeStage *)this,
                                                   0x8237,&local_1e8,&local_1f8);
                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                  tcu::Vector<int,_4>::Vector(&local_208,1,-2,3,-4);
                                  tcu::Vector<int,_4>::Vector(&local_218,1,0,0,1);
                                  bVar1 = gl4cts::(anonymous_namespace)::
                                          BasicAllFormatsLoadStoreComputeStage::
                                          Read<tcu::Vector<int,4>>
                                                    ((BasicAllFormatsLoadStoreComputeStage *)this,
                                                     0x8231,&local_208,&local_218);
                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                    tcu::Vector<unsigned_int,_4>::Vector(&local_228,0,1,2,3);
                                    tcu::Vector<unsigned_int,_4>::Vector(&local_238,0,1,2,3);
                                    bVar1 = gl4cts::(anonymous_namespace)::
                                            BasicAllFormatsLoadStoreComputeStage::
                                            Read<tcu::Vector<unsigned_int,4>>
                                                      ((BasicAllFormatsLoadStoreComputeStage *)this,
                                                       0x8d70,&local_228,&local_238);
                                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                                      tcu::Vector<unsigned_int,_4>::Vector(&local_248,0,1,2,3);
                                      tcu::Vector<unsigned_int,_4>::Vector(&local_258,0,1,2,3);
                                      bVar1 = gl4cts::(anonymous_namespace)::
                                              BasicAllFormatsLoadStoreComputeStage::
                                              Read<tcu::Vector<unsigned_int,4>>
                                                        ((BasicAllFormatsLoadStoreComputeStage *)
                                                         this,0x906f,&local_248,&local_258);
                                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                                        tcu::Vector<unsigned_int,_4>::Vector(&local_268,0,1,2,3);
                                        tcu::Vector<unsigned_int,_4>::Vector(&local_278,0,1,0,1);
                                        bVar1 = gl4cts::(anonymous_namespace)::
                                                BasicAllFormatsLoadStoreComputeStage::
                                                Read<tcu::Vector<unsigned_int,4>>
                                                          ((BasicAllFormatsLoadStoreComputeStage *)
                                                           this,0x823c,&local_268,&local_278);
                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                                          tcu::Vector<unsigned_int,_4>::Vector(&local_288,7,2,3,4);
                                          tcu::Vector<unsigned_int,_4>::Vector(&local_298,7,0,0,1);
                                          bVar1 = gl4cts::(anonymous_namespace)::
                                                  BasicAllFormatsLoadStoreComputeStage::
                                                  Read<tcu::Vector<unsigned_int,4>>
                                                            ((BasicAllFormatsLoadStoreComputeStage *
                                                             )this,0x8236,&local_288,&local_298);
                                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                                            tcu::Vector<unsigned_int,_4>::Vector(&local_2a8,0,1,2,3)
                                            ;
                                            tcu::Vector<unsigned_int,_4>::Vector(&local_2b8,0,1,2,3)
                                            ;
                                            bVar1 = gl4cts::(anonymous_namespace)::
                                                    BasicAllFormatsLoadStoreComputeStage::
                                                    Read<tcu::Vector<unsigned_int,4>>
                                                              ((BasicAllFormatsLoadStoreComputeStage
                                                                *)this,0x8d76,&local_2a8,&local_2b8)
                                            ;
                                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                                              tcu::Vector<unsigned_int,_4>::Vector
                                                        (&local_2c8,0,1,2,3);
                                              tcu::Vector<unsigned_int,_4>::Vector
                                                        (&local_2d8,0,1,0,1);
                                              bVar1 = gl4cts::(anonymous_namespace)::
                                                      BasicAllFormatsLoadStoreComputeStage::
                                                      Read<tcu::Vector<unsigned_int,4>>
                                                                ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x823a
                                                  ,&local_2c8,&local_2d8);
                                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                tcu::Vector<unsigned_int,_4>::Vector
                                                          (&local_2e8,7,2,3,4);
                                                tcu::Vector<unsigned_int,_4>::Vector
                                                          (&local_2f8,7,0,0,1);
                                                bVar1 = gl4cts::(anonymous_namespace)::
                                                        BasicAllFormatsLoadStoreComputeStage::
                                                        Read<tcu::Vector<unsigned_int,4>>
                                                                  ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x8234
                                                  ,&local_2e8,&local_2f8);
                                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                  tcu::Vector<unsigned_int,_4>::Vector
                                                            (&local_308,0,1,2,3);
                                                  tcu::Vector<unsigned_int,_4>::Vector
                                                            (&local_318,0,1,2,3);
                                                  bVar1 = gl4cts::(anonymous_namespace)::
                                                          BasicAllFormatsLoadStoreComputeStage::
                                                          Read<tcu::Vector<unsigned_int,4>>
                                                                    ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x8d7c
                                                  ,&local_308,&local_318);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<unsigned_int,_4>::Vector
                                                              (&local_328,0,1,2,3);
                                                    tcu::Vector<unsigned_int,_4>::Vector
                                                              (&local_338,0,1,0,1);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<unsigned_int,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x8238
                                                  ,&local_328,&local_338);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<unsigned_int,_4>::Vector
                                                              (&local_348,7,2,3,4);
                                                    tcu::Vector<unsigned_int,_4>::Vector
                                                              (&local_358,7,0,0,1);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<unsigned_int,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x8232
                                                  ,&local_348,&local_358);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector(&local_368,1.0);
                                                    tcu::Vector<float,_4>::Vector(&local_378,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x805b
                                                  ,&local_368,&local_378);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector(&local_388,1.0);
                                                    tcu::Vector<float,_4>::Vector(&local_398,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x8059
                                                  ,&local_388,&local_398);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector(&local_3a8,1.0);
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_3b8,1.0,1.0,0.0,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x822c
                                                  ,&local_3a8,&local_3b8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector(&local_3c8,1.0);
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_3d8,1.0,0.0,0.0,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x822a
                                                  ,&local_3c8,&local_3d8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector(&local_3e8,1.0);
                                                    tcu::Vector<float,_4>::Vector(&local_3f8,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x8058
                                                  ,&local_3e8,&local_3f8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector(&local_408,1.0);
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_418,1.0,1.0,0.0,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x822b
                                                  ,&local_408,&local_418);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector(&local_428,1.0);
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_438,1.0,0.0,0.0,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x8229
                                                  ,&local_428,&local_438);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_448,1.0,-1.0,1.0,-1.0);
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_458,1.0,-1.0,1.0,-1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x8f9b
                                                  ,&local_448,&local_458);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector(&local_468,-1.0);
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_478,-1.0,-1.0,0.0,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x8f99
                                                  ,&local_468,&local_478);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_488,-1.0,1.0,-1.0,1.0);
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_498,-1.0,0.0,0.0,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x8f98
                                                  ,&local_488,&local_498);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_4a8,1.0,-1.0,1.0,-1.0);
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_4b8,1.0,-1.0,1.0,-1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x8f97
                                                  ,&local_4a8,&local_4b8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector(&local_4c8,-1.0);
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_4d8,-1.0,-1.0,0.0,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x8f95
                                                  ,&local_4c8,&local_4d8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_4e8,-1.0,1.0,-1.0,1.0);
                                                    tcu::Vector<float,_4>::Vector
                                                              (&local_4f8,-1.0,0.0,0.0,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoadStoreComputeStage::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((
                                                  BasicAllFormatsLoadStoreComputeStage *)this,0x8f94
                                                  ,&local_4e8,&local_4f8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)0x0;
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                  }
                                                  else {
                                                    this_local = (
                                                  BasicAllFormatsLoadStoreComputeStage *)
                                                  &DAT_ffffffffffffffff;
                                                  }
                                                }
                                                else {
                                                  this_local = (BasicAllFormatsLoadStoreComputeStage
                                                                *)&DAT_ffffffffffffffff;
                                                }
                                              }
                                              else {
                                                this_local = (BasicAllFormatsLoadStoreComputeStage *
                                                             )&DAT_ffffffffffffffff;
                                              }
                                            }
                                            else {
                                              this_local = (BasicAllFormatsLoadStoreComputeStage *)
                                                           &DAT_ffffffffffffffff;
                                            }
                                          }
                                          else {
                                            this_local = (BasicAllFormatsLoadStoreComputeStage *)
                                                         &DAT_ffffffffffffffff;
                                          }
                                        }
                                        else {
                                          this_local = (BasicAllFormatsLoadStoreComputeStage *)
                                                       &DAT_ffffffffffffffff;
                                        }
                                      }
                                      else {
                                        this_local = (BasicAllFormatsLoadStoreComputeStage *)
                                                     &DAT_ffffffffffffffff;
                                      }
                                    }
                                    else {
                                      this_local = (BasicAllFormatsLoadStoreComputeStage *)
                                                   &DAT_ffffffffffffffff;
                                    }
                                  }
                                  else {
                                    this_local = (BasicAllFormatsLoadStoreComputeStage *)
                                                 &DAT_ffffffffffffffff;
                                  }
                                }
                                else {
                                  this_local = (BasicAllFormatsLoadStoreComputeStage *)
                                               &DAT_ffffffffffffffff;
                                }
                              }
                              else {
                                this_local = (BasicAllFormatsLoadStoreComputeStage *)
                                             &DAT_ffffffffffffffff;
                              }
                            }
                            else {
                              this_local = (BasicAllFormatsLoadStoreComputeStage *)
                                           &DAT_ffffffffffffffff;
                            }
                          }
                          else {
                            this_local = (BasicAllFormatsLoadStoreComputeStage *)
                                         &DAT_ffffffffffffffff;
                          }
                        }
                        else {
                          this_local = (BasicAllFormatsLoadStoreComputeStage *)&DAT_ffffffffffffffff
                          ;
                        }
                      }
                      else {
                        this_local = (BasicAllFormatsLoadStoreComputeStage *)&DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      this_local = (BasicAllFormatsLoadStoreComputeStage *)&DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    this_local = (BasicAllFormatsLoadStoreComputeStage *)&DAT_ffffffffffffffff;
                  }
                }
                else {
                  this_local = (BasicAllFormatsLoadStoreComputeStage *)&DAT_ffffffffffffffff;
                }
              }
              else {
                this_local = (BasicAllFormatsLoadStoreComputeStage *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (BasicAllFormatsLoadStoreComputeStage *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (BasicAllFormatsLoadStoreComputeStage *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicAllFormatsLoadStoreComputeStage *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicAllFormatsLoadStoreComputeStage *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicAllFormatsLoadStoreComputeStage *)&DAT_ffffffffffffffff;
    }
  }
  else {
    anon_unknown_0::Output("GL_ARB_compute_shader not supported, skipping test\n");
    this_local = (BasicAllFormatsLoadStoreComputeStage *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_compute_shader"))
		{
			Output("GL_ARB_compute_shader not supported, skipping test\n");
			return NOT_SUPPORTED;
		}

		if (!Read(GL_RGBA32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 4.0f)))
			return ERROR;
		if (!Read(GL_RG32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Read(GL_R32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		if (!Read(GL_RGBA16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 4.0f)))
			return ERROR;
		if (!Read(GL_RG16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Read(GL_R16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		if (!Read(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Read(GL_RG32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 0, 1)))
			return ERROR;
		if (!Read(GL_R32I, ivec4(1, -2, 3, -4), ivec4(1, 0, 0, 1)))
			return ERROR;

		if (!Read(GL_R11F_G11F_B10F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 1.0f)))
			return ERROR;

		if (!Read(GL_RGBA16I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Read(GL_RG16I, ivec4(1, -2, 3, -4), ivec4(1, -2, 0, 1)))
			return ERROR;
		if (!Read(GL_R16I, ivec4(1, -2, 3, -4), ivec4(1, 0, 0, 1)))
			return ERROR;

		if (!Read(GL_RGBA8I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Read(GL_RG8I, ivec4(1, -2, 3, -4), ivec4(1, -2, 0, 1)))
			return ERROR;
		if (!Read(GL_R8I, ivec4(1, -2, 3, -4), ivec4(1, 0, 0, 1)))
			return ERROR;

		if (!Read(GL_RGBA32UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Read(GL_RGB10_A2UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Read(GL_RG32UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 0, 1)))
			return ERROR;
		if (!Read(GL_R32UI, uvec4(7, 2, 3, 4), uvec4(7, 0, 0, 1)))
			return ERROR;

		if (!Read(GL_RGBA16UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Read(GL_RG16UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 0, 1)))
			return ERROR;
		if (!Read(GL_R16UI, uvec4(7, 2, 3, 4), uvec4(7, 0, 0, 1)))
			return ERROR;

		if (!Read(GL_RGBA8UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Read(GL_RG8UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 0, 1)))
			return ERROR;
		if (!Read(GL_R8UI, uvec4(7, 2, 3, 4), uvec4(7, 0, 0, 1)))
			return ERROR;

		if (!Read(GL_RGBA16, vec4(1.0f), vec4(1.0f)))
			return ERROR;
		if (!Read(GL_RGB10_A2, vec4(1.0f), vec4(1.0f)))
			return ERROR;
		if (!Read(GL_RG16, vec4(1.0f), vec4(1.0f, 1.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Read(GL_R16, vec4(1.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		if (!Read(GL_RGBA8, vec4(1.0f), vec4(1.0f)))
			return ERROR;
		if (!Read(GL_RG8, vec4(1.0f), vec4(1.0f, 1.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Read(GL_R8, vec4(1.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		if (!Read(GL_RGBA16_SNORM, vec4(1.0f, -1.0f, 1.0f, -1.0f), vec4(1.0f, -1.0f, 1.0f, -1.0f)))
			return ERROR;
		if (!Read(GL_RG16_SNORM, vec4(-1.0f), vec4(-1.0f, -1.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Read(GL_R16_SNORM, vec4(-1.0f, 1.0f, -1.0f, 1.0f), vec4(-1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		if (!Read(GL_RGBA8_SNORM, vec4(1.0f, -1.0f, 1.0f, -1.0f), vec4(1.0f, -1.0f, 1.0f, -1.0f)))
			return ERROR;
		if (!Read(GL_RG8_SNORM, vec4(-1.0f), vec4(-1.0f, -1.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Read(GL_R8_SNORM, vec4(-1.0f, 1.0f, -1.0f, 1.0f), vec4(-1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		return NO_ERROR;
	}